

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<true,true,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  iVar3 = *(int *)(this + 0x14);
  if ((long)iVar3 < 1) {
    auVar9 = ZEXT816(0);
  }
  else {
    lVar4 = *(long *)(this + 0xf8);
    lVar5 = *(long *)(this + 0x78);
    lVar6 = *(long *)(this + 0xf0);
    auVar9 = ZEXT816(0);
    lVar8 = 0;
    do {
      auVar10._0_4_ = *(float *)(lVar4 + lVar8 * 4) / *(float *)(lVar6 + lVar8 * 4);
      auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar9 = vcvtps2pd_avx(auVar9);
      auVar10 = vinsertps_avx(ZEXT416((uint)(auVar10._0_4_ * auVar10._0_4_)),auVar10,0x10);
      auVar10 = vcvtps2pd_avx(auVar10);
      dVar1 = (double)vmovhpd_avx(auVar10);
      outDerivatives[lVar8] = dVar1;
      uVar2 = *(undefined8 *)(lVar5 + lVar8 * 8);
      auVar7._8_8_ = uVar2;
      auVar7._0_8_ = uVar2;
      auVar9 = vfmadd231pd_avx512vl(auVar9,auVar10,auVar7);
      auVar9 = vcvtpd2ps_avx(auVar9);
      lVar8 = lVar8 + 1;
    } while (iVar3 != lVar8);
    auVar9 = vcvtps2pd_avx(auVar9);
  }
  dVar1 = (double)vmovhps_avx(auVar9);
  *outSumDerivatives = dVar1;
  dVar1 = (double)vmovlps_avx(auVar9);
  *outSumSquaredDerivatives = dVar1;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}